

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O0

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  byte bVar1;
  int local_24;
  int i;
  char *signature_local;
  stbi__context *s_local;
  
  local_24 = 0;
  while( true ) {
    if (signature[local_24] == '\0') {
      stbi__rewind(s);
      return 1;
    }
    bVar1 = stbi__get8(s);
    if ((uint)bVar1 != (int)signature[local_24]) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}